

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

bool ImPlot::IsPlotYAxisHovered(ImPlotYAxis y_axis_in)

{
  bool bVar1;
  int local_24;
  ImPlotYAxis y_axis;
  ImPlotContext *gp;
  ImPlotYAxis y_axis_in_local;
  
  bVar1 = false;
  if ((-2 < y_axis_in) && (bVar1 = false, y_axis_in < 3)) {
    bVar1 = true;
  }
  if (!bVar1) {
    __assert_fail("(y_axis_in >= -1 && y_axis_in < 3) && \"y_axis needs to between -1 and IMPLOT_Y_AXES\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xa84,"bool ImPlot::IsPlotYAxisHovered(ImPlotYAxis)");
  }
  if (GImPlot->CurrentPlot != (ImPlotPlot *)0x0) {
    local_24 = y_axis_in;
    if (y_axis_in < 0) {
      local_24 = GImPlot->CurrentPlot->CurrentYAxis;
    }
    return (bool)(GImPlot->CurrentPlot->YAxis[local_24].ExtHovered & 1);
  }
  __assert_fail("(gp.CurrentPlot != __null) && \"IsPlotYAxisHovered() needs to be called between BeginPlot() and EndPlot()!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xa85,"bool ImPlot::IsPlotYAxisHovered(ImPlotYAxis)");
}

Assistant:

bool IsPlotYAxisHovered(ImPlotYAxis y_axis_in) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(y_axis_in >= -1 && y_axis_in < IMPLOT_Y_AXES, "y_axis needs to between -1 and IMPLOT_Y_AXES");
    IM_ASSERT_USER_ERROR(gp.CurrentPlot != NULL, "IsPlotYAxisHovered() needs to be called between BeginPlot() and EndPlot()!");
    const ImPlotYAxis y_axis = y_axis_in >= 0 ? y_axis_in : gp.CurrentPlot->CurrentYAxis;
    return gp.CurrentPlot->YAxis[y_axis].ExtHovered;
}